

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

void Execute(function<int_(int)> *function)

{
  ostream *poVar1;
  duration<double,_std::ratio<1L,_1L>_> __rhs;
  rep rVar2;
  double elapsed_ms;
  duration<double,_std::ratio<1L,_1L>_> finish_time;
  int i;
  duration<double,_std::ratio<1L,_1L>_> start_time;
  int in_stack_ffffffffffffffcc;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  GetCurrentTime();
  for (iVar3 = 0; iVar3 < 1000000; iVar3 = iVar3 + 1) {
    std::function<int_(int)>::operator()
              ((function<int_(int)> *)in_stack_ffffffffffffffd0.__r,in_stack_ffffffffffffffcc);
  }
  __rhs = GetCurrentTime();
  std::chrono::operator-
            ((duration<double,_std::ratio<1L,_1L>_> *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
             (duration<double,_std::ratio<1L,_1L>_> *)__rhs.__r);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffd0);
  poVar1 = std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2 * 1000.0);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(rVar2 * 1000.0) / 1000000.0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Execute(const std::function<int(int)>& function) {
  const auto start_time = GetCurrentTime();
  for (int i = 0; i < kIterations; ++i) {
    function(i);
  }
  const auto finish_time = GetCurrentTime();
  const double elapsed_ms = 1000. * (finish_time - start_time).count();
  std::cout << '\t' << elapsed_ms << '\t' << elapsed_ms / kIterations
            << std::endl;
}